

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall
RandStrAltList::RandStrAltList(RandStrAltList *this,RandStrParser *p,int isOuterExpr)

{
  RandStrNode *pRVar1;
  wchar_t wVar2;
  RandStrNode *this_00;
  RandStrNode **ppRVar3;
  
  (this->super_RandStrNode).nextSibling = (RandStrNode *)0x0;
  (this->super_RandStrNode).firstChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).lastChild = (RandStrNode *)0x0;
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00359008;
  this->altCount = 0;
  while( true ) {
    if (p->rem == 0) {
      return;
    }
    if ((isOuterExpr == 0) && (wVar2 = RandStrParser::getch(p), wVar2 == L')')) break;
    this_00 = (RandStrNode *)operator_new(0x20);
    RandStrCatList::RandStrCatList((RandStrCatList *)this_00,p);
    pRVar1 = (this->super_RandStrNode).lastChild;
    ppRVar3 = &pRVar1->nextSibling;
    if (pRVar1 == (RandStrNode *)0x0) {
      ppRVar3 = &(this->super_RandStrNode).firstChild;
    }
    *ppRVar3 = this_00;
    (this->super_RandStrNode).lastChild = this_00;
    this->altCount = this->altCount + 1;
    wVar2 = RandStrParser::getch(p);
    if (wVar2 == L'|') {
      RandStrParser::skip(p);
    }
  }
  return;
}

Assistant:

RandStrAltList(RandStrParser *p, int isOuterExpr)
    {
        /* no alternatives yet */
        altCount = 0;

        /* 
         *   parse alternatives until we reach the end of the string or a
         *   close paren (unless we're the outermost expression, in which
         *   case we treat ')' as an ordinary character since there's no
         *   enclosing group to close) 
         */
        while (p->more() && (isOuterExpr || p->getch() != ')'))
        {
            /* parse the next alternative and add it to our child list */
            addChild(new RandStrCatList(p));
            altCount += 1;

            /* if there's a '|', skip it */
            if (p->getch() == '|')
                p->skip();
        }
    }